

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsd_symbol.cpp
# Opt level: O0

int DSDcc::DSDSymbol::invert_dibit(int dibit)

{
  int dibit_local;
  int local_4;
  
  switch(dibit) {
  case 0:
    local_4 = 2;
    break;
  case 1:
    local_4 = 3;
    break;
  case 2:
    local_4 = 0;
    break;
  case 3:
    local_4 = 1;
    break;
  default:
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int DSDSymbol::invert_dibit(int dibit)
{
    switch (dibit)
    {
    case 0:
        return 2;
    case 1:
        return 3;
    case 2:
        return 0;
    case 3:
        return 1;
    }

    // Error, shouldn't be here
    assert(0);
    return -1;
}